

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O3

BranchInstr * __thiscall IR::BranchInstr::CloneBranchInstr(BranchInstr *this)

{
  Func *func;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  LabelInstr *branchTarget;
  BranchInstr *pBVar4;
  char *message;
  char *error;
  uint lineNumber;
  char *fileName;
  
  if (this->m_branchTarget == (LabelInstr *)0x0) {
    if (this->m_isMultiBranch == false) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x20e,"(m_isMultiBranch)","m_isMultiBranch");
      if (!bVar2) goto LAB_004b3ac1;
      *puVar3 = 0;
    }
    else {
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar3 = 1;
    fileName = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp";
    error = "(!this->IsMultiBranch())";
    message = "Cloning Not supported for MultiBranchInstr";
    lineNumber = 0x70c;
  }
  else {
    if (this->m_isMultiBranch == false) goto LAB_004b3a81;
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    fileName = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl";
    error = "(!m_isMultiBranch)";
    message = "!m_isMultiBranch";
    lineNumber = 0x209;
  }
  bVar2 = Js::Throw::ReportAssert(fileName,lineNumber,error,message);
  if (!bVar2) {
LAB_004b3ac1:
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  *puVar3 = 0;
LAB_004b3a81:
  func = (this->super_Instr).m_func;
  branchTarget = LabelInstr::CloneLabel(this->m_branchTarget,0);
  if (branchTarget == (LabelInstr *)0x0) {
    branchTarget = this->m_branchTarget;
    func->topFunc->m_cloner->fRetargetClonedBranch = 1;
  }
  pBVar4 = New((this->super_Instr).m_opcode,branchTarget,func);
  return pBVar4;
}

Assistant:

BranchInstr *
BranchInstr::CloneBranchInstr() const
{
    AssertMsg(!this->IsMultiBranch(),"Cloning Not supported for MultiBranchInstr");
    Func * func = this->m_func;
    // See if the target has already been cloned.
    IR::LabelInstr * instrLabel = this->GetTarget()->CloneLabel(false);
    if (instrLabel == nullptr)
    {
        // We didn't find a clone for this label.
        // We'll go back and retarget the cloned branch if the target turns up in the cloned range.
        instrLabel = this->GetTarget();
        func->GetCloner()->fRetargetClonedBranch = TRUE;
    }
    return IR::BranchInstr::New(this->m_opcode, instrLabel, func);
}